

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStreamPrivate::~QTextStreamPrivate(QTextStreamPrivate *this)

{
  long *in_RDI;
  
  if (((*(byte *)(in_RDI + 0x29) & 1) != 0) && ((long *)*in_RDI != (long *)0x0)) {
    (**(code **)(*(long *)*in_RDI + 8))();
  }
  QLocale::~QLocale((QLocale *)0x141acf);
  QString::~QString((QString *)0x141ae0);
  QString::~QString((QString *)0x141af1);
  QStringDecoder::~QStringDecoder((QStringDecoder *)0x141b02);
  QStringDecoder::~QStringDecoder((QStringDecoder *)0x141b10);
  QStringEncoder::~QStringEncoder((QStringEncoder *)0x141b1e);
  return;
}

Assistant:

QTextStreamPrivate::~QTextStreamPrivate()
{
    if (deleteDevice) {
#ifndef QT_NO_QOBJECT
        device->blockSignals(true);
#endif
        delete device;
    }
}